

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O3

void __thiscall tst_InsertProxyModel::testSourceInsertCol_data(tst_InsertProxyModel *this)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  int *piVar5;
  __atomic_base<int> _Var6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  QTestData *pQVar10;
  long lVar11;
  char cVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  QByteArray local_1e8;
  QArrayData *local_1d0;
  QArrayData *local_1c8;
  QArrayData *local_1c0;
  tst_InsertProxyModel *local_1b8;
  long local_1b0;
  char *local_1a8 [4];
  undefined1 local_188;
  undefined8 local_180;
  char *local_178;
  undefined8 local_170;
  long *local_168;
  long local_160;
  long local_158;
  QFlags<InsertProxyModel::InsertDirection> *local_150;
  long local_148;
  long local_140;
  long local_138;
  code *local_130;
  long local_128;
  char *local_120;
  qsizetype local_118;
  code *local_110;
  undefined8 local_108;
  char *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  char *local_c0;
  undefined8 local_b8;
  int local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  QMetaTypeInterface *local_90;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  local_90 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var6._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
               super___atomic_base<int>._M_i;
  local_1b8 = this;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var6._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var6._M_i,"baseModel");
  local_90 = &QtPrivate::QMetaTypeInterfaceWrapper<QFlags<InsertProxyModel::InsertDirection>_>::
              metaType;
  _Var6._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QFlags<InsertProxyModel::InsertDirection>_>::
               metaType.typeId;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QFlags<InsertProxyModel::InsertDirection>_>::metaType.
      typeId._q_value.super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var6._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var6._M_i,"insertDirection");
  QTest::addColumnInternal(2,"indexToInsert");
  QTest::addColumnInternal(1,"addViaProxy");
  local_90 = (QMetaTypeInterface *)CONCAT44(local_90._4_4_,1);
  local_88 = 0;
  local_80 = "Extra Row";
  local_78 = 9;
  local_70 = 2;
  local_68 = 0;
  local_60 = "Extra Column";
  local_58 = 0xc;
  local_50 = 3;
  local_48 = 0;
  local_40 = "Extra Row and Column";
  local_38 = 0x14;
  lVar13 = 0;
  do {
    local_150 = (QFlags<InsertProxyModel::InsertDirection> *)((long)&local_90 + lVar13);
    local_130 = createTableModel;
    local_128 = 0;
    local_120 = "Table";
    local_118 = 5;
    local_110 = createTreeModel;
    local_108 = 0;
    local_100 = "Tree";
    local_f8 = 4;
    local_148 = (long)&local_88 + lVar13;
    lVar15 = 0;
    local_158 = lVar13;
    do {
      plVar8 = (long *)(**(code **)((long)&local_130 + lVar15))(local_1b8);
      if (plVar8 != (long *)0x0) {
        local_f0._0_4_ = 0;
        local_e8 = 0;
        local_e0 = "Begin";
        local_d8 = 5;
        local_1a8[0] = (char *)0xffffffffffffffff;
        local_1a8[1] = (char *)0x0;
        local_1a8[2] = (char *)0x0;
        local_d0 = (**(code **)(*plVar8 + 0x80))(plVar8,local_1a8);
        local_c8 = 0;
        local_c0 = "End";
        local_b8 = 3;
        local_1e8.d.d = (Data *)0xffffffffffffffff;
        local_1e8.d.ptr = (char *)0x0;
        local_1e8.d.size = 0;
        local_168 = plVar8;
        iVar7 = (**(code **)(*plVar8 + 0x80))(plVar8,&local_1e8);
        local_b0 = iVar7 / 2;
        local_a8 = 0;
        local_a0 = "Middle";
        local_98 = 6;
        lVar11 = 0;
        local_1b0 = lVar15;
        do {
          local_140 = (long)&local_f0 + lVar11;
          local_1a8[0] = (char *)CONCAT71(local_1a8[0]._1_7_,1);
          local_1a8[1] = (char *)0x0;
          local_1a8[2] = "via Proxy";
          local_1a8[3] = (char *)0x9;
          local_188 = 0;
          local_180 = 0;
          local_178 = "via Base";
          local_170 = 8;
          local_138 = (long)&local_e8 + lVar11;
          lVar16 = 0;
          local_160 = lVar11;
          do {
            local_1e8.d.d = *(Data **)((long)&local_128 + lVar15);
            local_1e8.d.ptr = *(char **)((long)&local_120 + lVar15);
            local_1e8.d.size = *(qsizetype *)((long)&local_118 + lVar15);
            if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
            cVar12 = (char)&local_1e8;
            plVar8 = (long *)QByteArray::append(cVar12);
            local_1d0 = (QArrayData *)*plVar8;
            pcVar14 = (char *)plVar8[1];
            lVar13 = plVar8[2];
            if (local_1d0 != (QArrayData *)0x0) {
              LOCK();
              (local_1d0->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_1d0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,1,8);
              }
            }
            local_1e8.d.d = (Data *)local_1d0;
            if (local_1d0 != (QArrayData *)0x0) {
              LOCK();
              (local_1d0->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_1d0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_1e8.d.ptr = pcVar14;
            local_1e8.d.size = lVar13;
            plVar8 = (long *)QByteArray::append(&local_1e8);
            local_1c0 = (QArrayData *)*plVar8;
            pcVar14 = (char *)plVar8[1];
            lVar13 = plVar8[2];
            if (local_1c0 != (QArrayData *)0x0) {
              LOCK();
              (local_1c0->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_1c0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,1,8);
              }
            }
            local_1e8.d.d = (Data *)local_1c0;
            if (local_1c0 != (QArrayData *)0x0) {
              LOCK();
              (local_1c0->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_1c0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_1e8.d.ptr = pcVar14;
            local_1e8.d.size = lVar13;
            plVar8 = (long *)QByteArray::append(cVar12);
            local_1c8 = (QArrayData *)*plVar8;
            pcVar14 = (char *)plVar8[1];
            lVar13 = plVar8[2];
            if (local_1c8 != (QArrayData *)0x0) {
              LOCK();
              (local_1c8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_1c8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,1,8);
              }
            }
            local_1e8.d.d = (Data *)local_1c8;
            if (local_1c8 != (QArrayData *)0x0) {
              LOCK();
              (local_1c8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_1c8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_1e8.d.ptr = pcVar14;
            local_1e8.d.size = lVar13;
            puVar9 = (undefined8 *)QByteArray::append(&local_1e8);
            pQVar1 = (QArrayData *)*puVar9;
            pcVar14 = (char *)puVar9[1];
            qVar2 = puVar9[2];
            if (pQVar1 != (QArrayData *)0x0) {
              LOCK();
              (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,1,8);
              }
            }
            if (pQVar1 != (QArrayData *)0x0) {
              LOCK();
              (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_1e8.d.d = (Data *)pQVar1;
            local_1e8.d.ptr = pcVar14;
            local_1e8.d.size = qVar2;
            puVar9 = (undefined8 *)QByteArray::append(cVar12);
            pQVar3 = (QArrayData *)*puVar9;
            pcVar14 = (char *)puVar9[1];
            qVar2 = puVar9[2];
            if (pQVar3 != (QArrayData *)0x0) {
              LOCK();
              (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,1,8);
              }
            }
            if (pQVar3 != (QArrayData *)0x0) {
              LOCK();
              (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_1e8.d.d = (Data *)pQVar3;
            local_1e8.d.ptr = pcVar14;
            local_1e8.d.size = qVar2;
            puVar9 = (undefined8 *)QByteArray::append(&local_1e8);
            pQVar4 = (QArrayData *)*puVar9;
            pcVar14 = (char *)puVar9[1];
            if (pQVar4 != (QArrayData *)0x0) {
              LOCK();
              (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,1,8);
              }
            }
            if (pcVar14 == (char *)0x0) {
              pcVar14 = (char *)&QByteArray::_empty;
            }
            pQVar10 = (QTestData *)QTest::newRow(pcVar14);
            local_1e8.d.d = (Data *)(**(code **)((long)&local_130 + local_1b0))(local_1b8);
            pQVar10 = operator<<(pQVar10,(QAbstractItemModel **)&local_1e8);
            pQVar10 = operator<<(pQVar10,local_150);
            QTestData::append((int)pQVar10,(void *)0x2);
            QTestData::append((int)pQVar10,(void *)0x1);
            if (pQVar4 != (QArrayData *)0x0) {
              LOCK();
              (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar4,1,8);
              }
            }
            lVar15 = local_1b0;
            if (pQVar3 != (QArrayData *)0x0) {
              LOCK();
              (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar3,1,8);
              }
            }
            lVar13 = local_158;
            if (pQVar1 != (QArrayData *)0x0) {
              LOCK();
              (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar1,1,8);
              }
            }
            if (local_1c8 != (QArrayData *)0x0) {
              LOCK();
              (local_1c8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_1c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_1c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_1c8,1,8);
              }
            }
            pQVar1 = local_1d0;
            if (local_1c0 != (QArrayData *)0x0) {
              LOCK();
              (local_1c0->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_1c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_1c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_1c0,1,8);
              }
            }
            if (pQVar1 != (QArrayData *)0x0) {
              LOCK();
              (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar1,1,8);
              }
            }
            lVar16 = lVar16 + 0x20;
          } while (lVar16 != 0x40);
          lVar11 = 0x28;
          do {
            piVar5 = *(int **)((long)local_1a8 + lVar11);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                QArrayData::deallocate(*(QArrayData **)((long)local_1a8 + lVar11),1,8);
              }
            }
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != -0x18);
          lVar11 = local_160 + 0x20;
        } while (lVar11 != 0x60);
        lVar11 = 0x48;
        do {
          piVar5 = *(int **)((long)&local_f0 + lVar11);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              QArrayData::deallocate(*(QArrayData **)((long)&local_f0 + lVar11),1,8);
            }
          }
          lVar11 = lVar11 + -0x20;
        } while (lVar11 != -0x18);
        QObject::deleteLater();
      }
      lVar15 = lVar15 + 0x20;
    } while (lVar15 != 0x40);
    lVar15 = 0x28;
    do {
      piVar5 = *(int **)((long)&local_130 + lVar15);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate(*(QArrayData **)((long)&local_130 + lVar15),1,8);
        }
      }
      lVar15 = lVar15 + -0x20;
    } while (lVar15 != -0x18);
    lVar13 = lVar13 + 0x20;
  } while (lVar13 != 0x60);
  lVar13 = 0x48;
  do {
    piVar5 = *(int **)((long)&local_90 + lVar13);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate(*(QArrayData **)((long)&local_90 + lVar13),1,8);
      }
    }
    lVar13 = lVar13 + -0x20;
  } while (lVar13 != -0x18);
  return;
}

Assistant:

void tst_InsertProxyModel::testSourceInsertCol_data()
{

    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<InsertProxyModel::InsertDirections>("insertDirection");
    QTest::addColumn<int>("indexToInsert");
    QTest::addColumn<bool>("addViaProxy");

    for (auto &&insertDirection :
         {std::make_pair<InsertProxyModel::InsertDirections, QByteArray>(InsertProxyModel::InsertRow, QByteArrayLiteral("Extra Row")),
          std::make_pair<InsertProxyModel::InsertDirections, QByteArray>(InsertProxyModel::InsertColumn, QByteArrayLiteral("Extra Column")),
          std::make_pair<InsertProxyModel::InsertDirections, QByteArray>(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow,
                                                                         QByteArrayLiteral("Extra Row and Column"))}) {

        for (auto &&baseModel :
             {std::make_pair(&createTableModel, QByteArrayLiteral("Table")), std::make_pair(&createTreeModel, QByteArrayLiteral("Tree"))}) {
            QAbstractItemModel *const tempModel = baseModel.first(this);
            if (tempModel) {
                for (auto &&indexToInsert :
                     {std::make_pair(0, QByteArrayLiteral("Begin")), std::make_pair(tempModel->columnCount(), QByteArrayLiteral("End")),
                      std::make_pair(tempModel->columnCount() / 2, QByteArrayLiteral("Middle"))}) {
                    for (auto &&addViaProxy :
                         {std::make_pair(true, QByteArrayLiteral("via Proxy")), std::make_pair(false, QByteArrayLiteral("via Base"))}) {
                        QTest::newRow(
                                (baseModel.second + ' ' + insertDirection.second + ' ' + addViaProxy.second + ' ' + indexToInsert.second).constData())
                                << baseModel.first(this) << insertDirection.first << indexToInsert.first << addViaProxy.first;
                    }
                }
                tempModel->deleteLater();
            }
        }
    }
}